

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteInlineImport(WatWriter *this,ExternalKind kind,Index index)

{
  size_type sVar1;
  reference ppIVar2;
  string_view local_48;
  string_view local_38;
  value_type local_28;
  Import *import;
  size_t kind_index;
  Index index_local;
  ExternalKind kind_local;
  WatWriter *this_local;
  
  if ((this->options_->inline_import & 1U) != 0) {
    import = (Import *)(long)(int)kind;
    kind_index._0_4_ = index;
    kind_index._4_4_ = kind;
    _index_local = this;
    sVar1 = std::vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>::size
                      (this->inline_import_map_ + (long)import);
    if (index < sVar1) {
      ppIVar2 = std::vector<const_wabt::Import_*,_std::allocator<const_wabt::Import_*>_>::operator[]
                          (this->inline_import_map_ + (long)import,(ulong)(Index)kind_index);
      local_28 = *ppIVar2;
      WriteOpenSpace(this,"import");
      string_view::string_view(&local_38,&local_28->module_name);
      WriteQuotedString(this,local_38,Space);
      string_view::string_view(&local_48,&local_28->field_name);
      WriteQuotedString(this,local_48,Space);
      WriteCloseSpace(this);
    }
  }
  return;
}

Assistant:

void WatWriter::WriteInlineImport(ExternalKind kind, Index index) {
  if (!options_.inline_import) {
    return;
  }

  size_t kind_index = static_cast<size_t>(kind);

  if (index >= inline_import_map_[kind_index].size()) {
    return;
  }

  const Import* import = inline_import_map_[kind_index][index];
  WriteOpenSpace("import");
  WriteQuotedString(import->module_name, NextChar::Space);
  WriteQuotedString(import->field_name, NextChar::Space);
  WriteCloseSpace();
}